

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsHasExternalData(JsValueRef object,bool *value)

{
  bool bVar1;
  bool local_42;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  bool *value_local;
  JsValueRef object_local;
  
  if (object == (JsValueRef)0x0) {
    object_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (value == (bool *)0x0) {
    object_local._4_4_ = JsErrorNullArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)value;
    DebugCheckNoException::DebugCheckNoException(&local_28);
    value_local = (bool *)object;
    while( true ) {
      bVar1 = Js::VarIs<Js::JavascriptProxy>(value_local);
      if (!bVar1) break;
      value_local = (bool *)Js::UnsafeVarTo<Js::JavascriptProxy>(value_local);
    }
    bVar1 = Js::VarIs<JsrtExternalObject>(value_local);
    local_42 = true;
    if (!bVar1) {
      local_42 = Js::VarIs<Js::CustomExternalWrapperObject>(value_local);
    }
    *(bool *)__debugCheckNoException = local_42;
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
    object_local._4_4_ = JsNoError;
  }
  return object_local._4_4_;
}

Assistant:

CHAKRA_API JsHasExternalData(_In_ JsValueRef object, _Out_ bool *value)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(value);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
        }
        *value = (Js::VarIs<JsrtExternalObject>(object)
#ifdef _CHAKRACOREBUILD
            || Js::VarIs<Js::CustomExternalWrapperObject>(object)
#endif
            );
    }